

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary_executor.hpp
# Opt level: O3

void duckdb::BinaryExecutor::
     ExecuteFlatLoop<signed_char,signed_char,signed_char,duckdb::BinaryStandardOperatorWrapper,duckdb::BitwiseShiftRightOperator,bool,false,true>
               (char *ldata,char *rdata,char *result_data,idx_t count,ValidityMask *mask,bool fun)

{
  byte bVar1;
  unsigned_long *puVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  char cVar7;
  idx_t iVar8;
  ulong uVar9;
  ulong uVar10;
  
  puVar2 = (mask->super_TemplatedValidityMask<unsigned_long>).validity_mask;
  if (puVar2 == (unsigned_long *)0x0) {
    if (count != 0) {
      bVar1 = *rdata;
      iVar8 = 0;
      do {
        cVar7 = (char)((int)ldata[iVar8] >> (bVar1 & 0x1f));
        if (7 < bVar1) {
          cVar7 = '\0';
        }
        result_data[iVar8] = cVar7;
        iVar8 = iVar8 + 1;
      } while (count != iVar8);
    }
  }
  else if (0x3f < count + 0x3f) {
    uVar9 = 0;
    uVar10 = 0;
    do {
      uVar3 = puVar2[uVar9];
      uVar4 = uVar10 + 0x40;
      if (count <= uVar10 + 0x40) {
        uVar4 = count;
      }
      uVar5 = uVar4;
      if (uVar3 != 0) {
        uVar5 = uVar10;
        if (uVar3 == 0xffffffffffffffff) {
          if (uVar10 < uVar4) {
            bVar1 = *rdata;
            do {
              cVar7 = (char)((int)ldata[uVar10] >> (bVar1 & 0x1f));
              if (7 < bVar1) {
                cVar7 = '\0';
              }
              result_data[uVar10] = cVar7;
              uVar10 = uVar10 + 1;
              uVar5 = uVar4;
            } while (uVar4 != uVar10);
          }
        }
        else if (uVar10 < uVar4) {
          uVar6 = 0;
          do {
            if ((uVar3 >> (uVar6 & 0x3f) & 1) != 0) {
              cVar7 = (char)((int)ldata[uVar6 + uVar10] >> (*rdata & 0x1fU));
              if (7 < (byte)*rdata) {
                cVar7 = '\0';
              }
              result_data[uVar6 + uVar10] = cVar7;
            }
            uVar6 = uVar6 + 1;
            uVar5 = uVar4;
          } while (uVar4 - uVar10 != uVar6);
        }
      }
      uVar9 = uVar9 + 1;
      uVar10 = uVar5;
    } while (uVar9 != count + 0x3f >> 6);
    return;
  }
  return;
}

Assistant:

static void ExecuteFlatLoop(const LEFT_TYPE *__restrict ldata, const RIGHT_TYPE *__restrict rdata,
	                            RESULT_TYPE *__restrict result_data, idx_t count, ValidityMask &mask, FUNC fun) {
		if (!LEFT_CONSTANT) {
			ASSERT_RESTRICT(ldata, ldata + count, result_data, result_data + count);
		}
		if (!RIGHT_CONSTANT) {
			ASSERT_RESTRICT(rdata, rdata + count, result_data, result_data + count);
		}

		if (!mask.AllValid()) {
			idx_t base_idx = 0;
			auto entry_count = ValidityMask::EntryCount(count);
			for (idx_t entry_idx = 0; entry_idx < entry_count; entry_idx++) {
				auto validity_entry = mask.GetValidityEntry(entry_idx);
				idx_t next = MinValue<idx_t>(base_idx + ValidityMask::BITS_PER_VALUE, count);
				if (ValidityMask::AllValid(validity_entry)) {
					// all valid: perform operation
					for (; base_idx < next; base_idx++) {
						auto lentry = ldata[LEFT_CONSTANT ? 0 : base_idx];
						auto rentry = rdata[RIGHT_CONSTANT ? 0 : base_idx];
						result_data[base_idx] =
						    OPWRAPPER::template Operation<FUNC, OP, LEFT_TYPE, RIGHT_TYPE, RESULT_TYPE>(
						        fun, lentry, rentry, mask, base_idx);
					}
				} else if (ValidityMask::NoneValid(validity_entry)) {
					// nothing valid: skip all
					base_idx = next;
					continue;
				} else {
					// partially valid: need to check individual elements for validity
					idx_t start = base_idx;
					for (; base_idx < next; base_idx++) {
						if (ValidityMask::RowIsValid(validity_entry, base_idx - start)) {
							auto lentry = ldata[LEFT_CONSTANT ? 0 : base_idx];
							auto rentry = rdata[RIGHT_CONSTANT ? 0 : base_idx];
							result_data[base_idx] =
							    OPWRAPPER::template Operation<FUNC, OP, LEFT_TYPE, RIGHT_TYPE, RESULT_TYPE>(
							        fun, lentry, rentry, mask, base_idx);
						}
					}
				}
			}
		} else {
			for (idx_t i = 0; i < count; i++) {
				auto lentry = ldata[LEFT_CONSTANT ? 0 : i];
				auto rentry = rdata[RIGHT_CONSTANT ? 0 : i];
				result_data[i] = OPWRAPPER::template Operation<FUNC, OP, LEFT_TYPE, RIGHT_TYPE, RESULT_TYPE>(
				    fun, lentry, rentry, mask, i);
			}
		}
	}